

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::UnicodeString::doReplace
          (UnicodeString *this,int32_t start,int32_t length,UChar *srcChars,int32_t srcStart,
          int32_t srcLength)

{
  UBool UVar1;
  int32_t iVar2;
  int newLength_00;
  int32_t iVar3;
  char16_t *pcVar4;
  UChar *newArray;
  int32_t *bufferToDelete;
  UChar oldStackBuffer [27];
  undefined1 local_80 [8];
  UnicodeString copy;
  UChar *oldArray;
  int32_t newLength;
  int32_t oldLength;
  int32_t srcLength_local;
  int32_t srcStart_local;
  UChar *srcChars_local;
  int32_t length_local;
  int32_t start_local;
  UnicodeString *this_local;
  
  srcChars_local._0_4_ = length;
  srcChars_local._4_4_ = start;
  _length_local = this;
  UVar1 = isWritable(this);
  if (UVar1 == '\0') {
    return this;
  }
  iVar2 = UnicodeString::length(this);
  if ((((this->fUnion).fStackFields.fLengthAndFlags & 8U) != 0) && (srcLength == 0)) {
    if (srcChars_local._4_4_ == 0) {
      pinIndex(this,(int32_t *)&srcChars_local);
      (this->fUnion).fFields.fArray = (this->fUnion).fFields.fArray + (int32_t)srcChars_local;
      (this->fUnion).fFields.fCapacity = (this->fUnion).fFields.fCapacity - (int32_t)srcChars_local;
      setLength(this,iVar2 - (int32_t)srcChars_local);
      return this;
    }
    pinIndex(this,(int32_t *)((long)&srcChars_local + 4));
    if (iVar2 - srcChars_local._4_4_ <= (int32_t)srcChars_local) {
      setLength(this,srcChars_local._4_4_);
      (this->fUnion).fFields.fCapacity = srcChars_local._4_4_;
      return this;
    }
  }
  if (srcChars_local._4_4_ == iVar2) {
    this_local = doAppend(this,srcChars,srcStart,srcLength);
  }
  else {
    if (srcChars == (UChar *)0x0) {
      newLength = 0;
      _srcLength_local = (UChar *)0x0;
    }
    else {
      _srcLength_local = srcChars + srcStart;
      newLength = srcLength;
      if (srcLength < 0) {
        newLength = u_strlen_63(_srcLength_local);
      }
    }
    pinIndices(this,(int32_t *)((long)&srcChars_local + 4),(int32_t *)&srcChars_local);
    this_local = this;
    if (0x7fffffff - (iVar2 - (int32_t)srcChars_local) < newLength) {
      setToBogus(this);
    }
    else {
      newLength_00 = newLength + (iVar2 - (int32_t)srcChars_local);
      copy.fUnion._48_8_ = getArrayStart(this);
      UVar1 = isBufferWritable(this);
      if (((UVar1 == '\0') || (_srcLength_local + newLength <= (ulong)copy.fUnion._48_8_)) ||
         ((UChar *)(copy.fUnion._48_8_ + (long)iVar2 * 2) <= _srcLength_local)) {
        if ((((this->fUnion).fStackFields.fLengthAndFlags & 2U) != 0) && (0x1b < newLength_00)) {
          u_memcpy_63((UChar *)&bufferToDelete,(UChar *)copy.fUnion._48_8_,iVar2);
          copy.fUnion._48_8_ = &bufferToDelete;
        }
        newArray = (UChar *)0x0;
        iVar3 = anon_unknown_11::getGrowCapacity(newLength_00);
        UVar1 = cloneArrayIfNeeded(this,newLength_00,iVar3,'\0',(int32_t **)&newArray,'\0');
        if (UVar1 != '\0') {
          pcVar4 = getArrayStart(this);
          if (pcVar4 == (char16_t *)copy.fUnion._48_8_) {
            if ((int32_t)srcChars_local != newLength) {
              us_arrayCopy((UChar *)copy.fUnion._48_8_,
                           srcChars_local._4_4_ + (int32_t)srcChars_local,pcVar4,
                           srcChars_local._4_4_ + newLength,
                           iVar2 - (srcChars_local._4_4_ + (int32_t)srcChars_local));
            }
          }
          else {
            us_arrayCopy((UChar *)copy.fUnion._48_8_,0,pcVar4,0,srcChars_local._4_4_);
            us_arrayCopy((UChar *)copy.fUnion._48_8_,srcChars_local._4_4_ + (int32_t)srcChars_local,
                         pcVar4,srcChars_local._4_4_ + newLength,
                         iVar2 - (srcChars_local._4_4_ + (int32_t)srcChars_local));
          }
          us_arrayCopy(_srcLength_local,0,pcVar4,srcChars_local._4_4_,newLength);
          setLength(this,newLength_00);
          if (newArray != (UChar *)0x0) {
            uprv_free_63(newArray);
          }
        }
      }
      else {
        UnicodeString((UnicodeString *)local_80,_srcLength_local,newLength);
        UVar1 = isBogus((UnicodeString *)local_80);
        iVar3 = srcChars_local._4_4_;
        iVar2 = (int32_t)srcChars_local;
        if (UVar1 == '\0') {
          pcVar4 = getArrayStart((UnicodeString *)local_80);
          this_local = doReplace(this,iVar3,iVar2,pcVar4,0,newLength);
        }
        else {
          setToBogus(this);
        }
        oldStackBuffer[0x18] = L'\x01';
        oldStackBuffer[0x19] = L'\0';
        ~UnicodeString((UnicodeString *)local_80);
      }
    }
  }
  return this_local;
}

Assistant:

UnicodeString&
UnicodeString::doReplace(int32_t start,
             int32_t length,
             const UChar *srcChars,
             int32_t srcStart,
             int32_t srcLength)
{
  if(!isWritable()) {
    return *this;
  }

  int32_t oldLength = this->length();

  // optimize (read-only alias).remove(0, start) and .remove(start, end)
  if((fUnion.fFields.fLengthAndFlags&kBufferIsReadonly) && srcLength == 0) {
    if(start == 0) {
      // remove prefix by adjusting the array pointer
      pinIndex(length);
      fUnion.fFields.fArray += length;
      fUnion.fFields.fCapacity -= length;
      setLength(oldLength - length);
      return *this;
    } else {
      pinIndex(start);
      if(length >= (oldLength - start)) {
        // remove suffix by reducing the length (like truncate())
        setLength(start);
        fUnion.fFields.fCapacity = start;  // not NUL-terminated any more
        return *this;
      }
    }
  }

  if(start == oldLength) {
    return doAppend(srcChars, srcStart, srcLength);
  }

  if(srcChars == 0) {
    srcLength = 0;
  } else {
    // Perform all remaining operations relative to srcChars + srcStart.
    // From this point forward, do not use srcStart.
    srcChars += srcStart;
    if (srcLength < 0) {
      // get the srcLength if necessary
      srcLength = u_strlen(srcChars);
    }
  }

  // pin the indices to legal values
  pinIndices(start, length);

  // Calculate the size of the string after the replace.
  // Avoid int32_t overflow.
  int32_t newLength = oldLength - length;
  if(srcLength > (INT32_MAX - newLength)) {
    setToBogus();
    return *this;
  }
  newLength += srcLength;

  // Check for insertion into ourself
  const UChar *oldArray = getArrayStart();
  if (isBufferWritable() &&
      oldArray < srcChars + srcLength &&
      srcChars < oldArray + oldLength) {
    // Copy into a new UnicodeString and start over
    UnicodeString copy(srcChars, srcLength);
    if (copy.isBogus()) {
      setToBogus();
      return *this;
    }
    return doReplace(start, length, copy.getArrayStart(), 0, srcLength);
  }

  // cloneArrayIfNeeded(doCopyArray=FALSE) may change fArray but will not copy the current contents;
  // therefore we need to keep the current fArray
  UChar oldStackBuffer[US_STACKBUF_SIZE];
  if((fUnion.fFields.fLengthAndFlags&kUsingStackBuffer) && (newLength > US_STACKBUF_SIZE)) {
    // copy the stack buffer contents because it will be overwritten with
    // fUnion.fFields values
    u_memcpy(oldStackBuffer, oldArray, oldLength);
    oldArray = oldStackBuffer;
  }

  // clone our array and allocate a bigger array if needed
  int32_t *bufferToDelete = 0;
  if(!cloneArrayIfNeeded(newLength, getGrowCapacity(newLength),
                         FALSE, &bufferToDelete)
  ) {
    return *this;
  }

  // now do the replace

  UChar *newArray = getArrayStart();
  if(newArray != oldArray) {
    // if fArray changed, then we need to copy everything except what will change
    us_arrayCopy(oldArray, 0, newArray, 0, start);
    us_arrayCopy(oldArray, start + length,
                 newArray, start + srcLength,
                 oldLength - (start + length));
  } else if(length != srcLength) {
    // fArray did not change; copy only the portion that isn't changing, leaving a hole
    us_arrayCopy(oldArray, start + length,
                 newArray, start + srcLength,
                 oldLength - (start + length));
  }

  // now fill in the hole with the new string
  us_arrayCopy(srcChars, 0, newArray, start, srcLength);

  setLength(newLength);

  // delayed delete in case srcChars == fArray when we started, and
  // to keep oldArray alive for the above operations
  if (bufferToDelete) {
    uprv_free(bufferToDelete);
  }

  return *this;
}